

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  int iVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  byte bVar5;
  uint32 uVar6;
  uint uVar7;
  uint uVar8;
  FieldDescriptor *pFVar9;
  ulong uVar10;
  Reflection *this;
  byte unaff_BPL;
  byte *pbVar11;
  byte *pbVar12;
  uint size;
  uint32 uVar13;
  string message_data;
  byte *local_a0;
  long local_98;
  byte local_90 [16];
  CodedInputStream local_80;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  local_a0 = local_90;
  local_98 = 0;
  local_90[0] = 0;
  uVar13 = 0;
  do {
    pbVar11 = input->buffer_;
    uVar6 = 0;
    if ((pbVar11 < input->buffer_end_) && (uVar6 = (uint32)*pbVar11, -1 < (char)*pbVar11)) {
      input->buffer_ = pbVar11 + 1;
    }
    else {
      uVar6 = io::CodedInputStream::ReadTagFallback(input,uVar6);
    }
    if ((int)uVar6 < 0x10) {
      if (uVar6 == 0) {
LAB_003809b0:
        bVar2 = false;
        unaff_BPL = 0;
      }
      else {
        if (uVar6 != 0xc) {
LAB_0038099c:
          bVar4 = SkipField(input,uVar6,(UnknownFieldSet *)0x0);
LAB_003809a8:
          if (bVar4 == false) goto LAB_003809b0;
          goto LAB_00380bb5;
        }
        unaff_BPL = 1;
        bVar2 = false;
      }
    }
    else {
      if (uVar6 != 0x10) {
        if (uVar6 != 0x1a) goto LAB_0038099c;
        if (uVar13 != 0) {
          pFVar9 = Reflection::FindKnownExtensionByNumber(this,uVar13);
          bVar4 = ParseAndMergeMessageSetField(uVar13,pFVar9,message,input);
          goto LAB_003809a8;
        }
        pbVar11 = input->buffer_;
        if (pbVar11 < input->buffer_end_) {
          bVar5 = *pbVar11;
          uVar10 = (ulong)bVar5;
          uVar13 = (uint32)bVar5;
          if ((char)bVar5 < '\0') goto LAB_00380afb;
          input->buffer_ = pbVar11 + 1;
          bVar5 = 0;
        }
        else {
          uVar13 = 0;
LAB_00380afb:
          uVar10 = io::CodedInputStream::ReadVarint32Fallback(input,uVar13);
          bVar5 = (byte)(uVar10 >> 0x3f);
        }
        size = (uint)uVar10;
        uVar13 = 0;
        bVar4 = false;
        bVar3 = 0;
        if (-1 < (int)size && bVar5 == 0) {
          iVar1 = 0x1f;
          if ((size | 1) != 0) {
            for (; (size | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
            }
          }
          bVar5 = (byte)uVar10;
          std::__cxx11::string::resize((ulong)&local_a0,(char)(iVar1 * 9 + 0x49U >> 6) + bVar5);
          if (size < 0x80) {
            *local_a0 = bVar5;
            pbVar11 = local_a0 + 1;
          }
          else {
            *local_a0 = bVar5 | 0x80;
            uVar10 = uVar10 >> 7 & 0x1ffffff;
            if (size < 0x4000) {
              local_a0[1] = (byte)uVar10;
              pbVar11 = local_a0 + 2;
            }
            else {
              pbVar11 = local_a0 + 2;
              do {
                pbVar12 = pbVar11;
                uVar7 = (uint)uVar10;
                pbVar12[-1] = (byte)uVar10 | 0x80;
                uVar8 = uVar7 >> 7;
                uVar10 = (ulong)uVar8;
                pbVar11 = pbVar12 + 1;
              } while (0x3fff < uVar7);
              *pbVar12 = (byte)uVar8;
            }
          }
          bVar4 = io::CodedInputStream::ReadRaw(input,pbVar11,size);
          bVar3 = unaff_BPL & bVar4;
        }
        unaff_BPL = bVar3;
        bVar2 = false;
        if (bVar4 != false) goto LAB_00380bb5;
        goto LAB_00380bb7;
      }
      pbVar11 = input->buffer_;
      if (pbVar11 < input->buffer_end_) {
        bVar5 = *pbVar11;
        uVar10 = (ulong)bVar5;
        uVar6 = (uint32)bVar5;
        if ((char)bVar5 < '\0') goto LAB_003809ff;
        input->buffer_ = pbVar11 + 1;
        bVar4 = true;
      }
      else {
        uVar6 = 0;
LAB_003809ff:
        uVar10 = io::CodedInputStream::ReadVarint32Fallback(input,uVar6);
        bVar4 = -1 < (long)uVar10;
      }
      uVar6 = (uint32)uVar10;
      if (bVar4) {
        uVar13 = uVar6;
        if (local_98 == 0) {
          bVar4 = true;
        }
        else {
          local_80.buffer_ = local_a0;
          local_80.total_bytes_read_ = (int)local_98;
          local_80.buffer_end_ = local_a0 + local_80.total_bytes_read_;
          local_80.input_ = (ZeroCopyInputStream *)0x0;
          local_80.overflow_bytes_ = 0;
          local_80.last_tag_ = 0;
          local_80.legitimate_message_end_ = false;
          local_80.aliasing_enabled_ = false;
          local_80.buffer_size_after_limit_ = 0;
          local_80.total_bytes_limit_ = 0x7fffffff;
          local_80.extension_pool_ = (DescriptorPool *)0x0;
          local_80.extension_factory_ = (MessageFactory *)0x0;
          local_80.recursion_budget_ = input->recursion_budget_;
          local_80.current_limit_ = local_80.total_bytes_read_;
          local_80.recursion_limit_ = local_80.recursion_budget_;
          pFVar9 = Reflection::FindKnownExtensionByNumber(this,uVar6);
          bVar4 = ParseAndMergeMessageSetField(uVar6,pFVar9,message,&local_80);
          if (bVar4) {
            local_98 = 0;
            *local_a0 = 0;
          }
          else {
            unaff_BPL = 0;
          }
          io::CodedInputStream::~CodedInputStream(&local_80);
        }
      }
      else {
        bVar4 = false;
        unaff_BPL = 0;
      }
      if (bVar4 == false) {
        bVar2 = false;
      }
      else {
LAB_00380bb5:
        bVar2 = true;
      }
    }
LAB_00380bb7:
    if (!bVar2) {
      if (local_a0 != local_90) {
        operator_delete(local_a0);
      }
      return (bool)(unaff_BPL & 1);
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, NULL);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}